

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mpir.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  ostringstream *this;
  char *pcVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  int num_output_order;
  allocator local_41d;
  int num_input_order;
  string local_418;
  vector<double,_std::allocator<double>_> cepstrum;
  vector<double,_std::allocator<double>_> minimum_phase_impulse_response;
  CepstrumToMinimumPhaseImpulseResponse cepstrum_to_minimum_phase_impulse_response;
  ostringstream error_message_5;
  ifstream ifs;
  byte abStack_218 [488];
  
  num_input_order = 0x19;
  num_output_order = 0xff;
LAB_001025c8:
  do {
    while (iVar3 = ya_getopt_long(argc,argv,"m:M:l:h",(option *)0x0,(int *)0x0), iVar3 == 0x4d) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_output_order);
      bVar8 = num_output_order < 0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar1 || bVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -M option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::__cxx11::string::string((string *)&error_message_5,"c2mpir",(allocator *)&local_418);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
LAB_00102967:
        std::__cxx11::string::~string((string *)&error_message_5);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        return 1;
      }
    }
    if (iVar3 == 0x6c) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
      bVar8 = sptk::ConvertStringToInteger((string *)&ifs,&num_output_order);
      bVar1 = num_output_order < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar8 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_5,"c2mpir",(allocator *)&local_418);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_00102967;
      }
      num_output_order = num_output_order + -1;
      goto LAB_001025c8;
    }
    if (iVar3 != 0x6d) {
      if (iVar3 != -1) {
        if (iVar3 != 0x68) {
          anon_unknown.dwarf_2ae0::PrintUsage((ostream *)&std::cerr);
          return 1;
        }
        anon_unknown.dwarf_2ae0::PrintUsage((ostream *)&std::cout);
        return 0;
      }
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Too many input files");
        std::__cxx11::string::string((string *)&error_message_5,"c2mpir",(allocator *)&local_418);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_00102967;
      }
      if (argc == ya_optind) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = argv[ya_optind];
      }
      bVar1 = sptk::SetBinaryMode();
      this = (ostringstream *)&ifs;
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(this);
        std::operator<<((ostream *)this,"Cannot set translation mode");
        std::__cxx11::string::string((string *)&error_message_5,"c2mpir",(allocator *)&local_418);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_00102967;
      }
      std::ifstream::ifstream(this);
      if ((pcVar5 == (char *)0x0) ||
         (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar5),
         (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          this = (ostringstream *)&std::cin;
        }
        sptk::CepstrumToMinimumPhaseImpulseResponse::CepstrumToMinimumPhaseImpulseResponse
                  (&cepstrum_to_minimum_phase_impulse_response,num_input_order,num_output_order);
        if (cepstrum_to_minimum_phase_impulse_response.is_valid_ != false) {
          lVar6 = (long)num_input_order;
          lVar7 = (long)num_output_order;
          std::vector<double,_std::allocator<double>_>::vector
                    (&cepstrum,lVar6 + 1U,(allocator_type *)&error_message_5);
          std::vector<double,_std::allocator<double>_>::vector
                    (&minimum_phase_impulse_response,lVar7 + 1U,(allocator_type *)&error_message_5);
          break;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        std::operator<<((ostream *)&error_message_5,
                        "Failed to initialize CepstrumToMinimumPhaseImpulseResponse");
        std::__cxx11::string::string((string *)&local_418,"c2mpir",(allocator *)&cepstrum);
        sptk::PrintErrorMessage(&local_418,&error_message_5);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        poVar4 = std::operator<<((ostream *)&error_message_5,"Cannot open file ");
        std::operator<<(poVar4,pcVar5);
        std::__cxx11::string::string
                  ((string *)&local_418,"c2mpir",
                   (allocator *)&cepstrum_to_minimum_phase_impulse_response);
        sptk::PrintErrorMessage(&local_418,&error_message_5);
      }
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
      iVar3 = 1;
      goto LAB_00102b99;
    }
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
    bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_input_order);
    bVar8 = num_input_order < 0;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar1 || bVar8) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
      std::operator<<(poVar4,"non-negative integer");
      std::__cxx11::string::string((string *)&error_message_5,"c2mpir",(allocator *)&local_418);
      sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
      goto LAB_00102967;
    }
  } while( true );
LAB_00102a19:
  bVar1 = sptk::ReadStream<double>(false,0,0,(int)(lVar6 + 1U),&cepstrum,(istream *)this,(int *)0x0)
  ;
  if (!bVar1) {
    iVar3 = 0;
    goto LAB_00102b85;
  }
  bVar1 = sptk::CepstrumToMinimumPhaseImpulseResponse::Run
                    (&cepstrum_to_minimum_phase_impulse_response,&cepstrum,
                     &minimum_phase_impulse_response);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
    std::operator<<((ostream *)&error_message_5,
                    "Failed to convert cepstrum to minimum phase impulse response");
    std::__cxx11::string::string((string *)&local_418,"c2mpir",&local_41d);
    sptk::PrintErrorMessage(&local_418,&error_message_5);
    goto LAB_00102b6b;
  }
  bVar1 = sptk::WriteStream<double>
                    (0,(int)(lVar7 + 1U),&minimum_phase_impulse_response,(ostream *)&std::cout,
                     (int *)0x0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
    std::operator<<((ostream *)&error_message_5,"Failed to write minimum phase impulse response");
    std::__cxx11::string::string((string *)&local_418,"c2mpir",&local_41d);
    sptk::PrintErrorMessage(&local_418,&error_message_5);
LAB_00102b6b:
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
    iVar3 = 1;
LAB_00102b85:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&minimum_phase_impulse_response.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&cepstrum.super__Vector_base<double,_std::allocator<double>_>);
LAB_00102b99:
    std::ifstream::~ifstream(&ifs);
    return iVar3;
  }
  goto LAB_00102a19;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_input_order(kDefaultNumInputOrder);
  int num_output_order(kDefaultNumOutputOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:M:l:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_input_order) ||
            num_input_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("c2mpir", error_message);
          return 1;
        }
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &num_output_order) ||
            num_output_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("c2mpir", error_message);
          return 1;
        }
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_output_order) ||
            num_output_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("c2mpir", error_message);
          return 1;
        }
        --num_output_order;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("c2mpir", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("c2mpir", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("c2mpir", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::CepstrumToMinimumPhaseImpulseResponse
      cepstrum_to_minimum_phase_impulse_response(num_input_order,
                                                 num_output_order);
  if (!cepstrum_to_minimum_phase_impulse_response.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize CepstrumToMinimumPhaseImpulseResponse";
    sptk::PrintErrorMessage("c2mpir", error_message);
    return 1;
  }

  const int input_length(num_input_order + 1);
  const int output_length(num_output_order + 1);
  std::vector<double> cepstrum(input_length);
  std::vector<double> minimum_phase_impulse_response(output_length);

  while (sptk::ReadStream(false, 0, 0, input_length, &cepstrum, &input_stream,
                          NULL)) {
    if (!cepstrum_to_minimum_phase_impulse_response.Run(
            cepstrum, &minimum_phase_impulse_response)) {
      std::ostringstream error_message;
      error_message
          << "Failed to convert cepstrum to minimum phase impulse response";
      sptk::PrintErrorMessage("c2mpir", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, output_length, minimum_phase_impulse_response,
                           &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write minimum phase impulse response";
      sptk::PrintErrorMessage("c2mpir", error_message);
      return 1;
    }
  }

  return 0;
}